

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

void __thiscall asl::HttpMessage::readBody(HttpMessage *this)

{
  HttpSink *pHVar1;
  HttpStatus *pHVar2;
  SmartObject_ *pSVar3;
  _FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *p_Var4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  String chunkSize;
  byte buffer [16000];
  
  String::String(&chunkSize,"Content-Length");
  header((String *)buffer,this,&chunkSize);
  uVar8 = String::operator_cast_to_int((String *)buffer);
  String::~String((String *)buffer);
  String::~String(&chunkSize);
  String::String(&chunkSize,"Transfer-Encoding");
  header((String *)buffer,this,&chunkSize);
  bVar6 = String::operator==((String *)buffer,"chunked");
  String::~String((String *)buffer);
  String::~String(&chunkSize);
  pHVar1 = ((this->_sink)._p)->p;
  (*pHVar1->_vptr_HttpSink[4])(pHVar1,(ulong)uVar8);
  (this->_socket->super_SmartObject)._p[3].field_0xc = 1;
  String::String((String *)buffer,"Content-Length");
  bVar7 = hasHeader(this,(String *)buffer);
  String::~String((String *)buffer);
  if (bVar7) {
    String::String(&chunkSize,"Content-Length");
    header((String *)buffer,this,&chunkSize);
    bVar7 = String::operator==((String *)buffer,"0");
    String::~String((String *)buffer);
    String::~String(&chunkSize);
    if (bVar7) {
      return;
    }
  }
  else if (!bVar6) {
    return;
  }
  pHVar2 = ((this->_status)._p)->p;
  pHVar2->totalReceive = uVar8;
  pHVar2->received = 0;
  iVar13 = 0;
  bVar7 = false;
  do {
    if (((bVar7) ||
        (iVar9 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xc])(), iVar9 < 0))
       || (iVar9 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xf])
                             (0x4024000000000000), (char)iVar9 == '\0')) {
      return;
    }
    uVar10 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xc])();
    uVar5 = uVar8;
    if (bVar6) {
      Socket::readLine(&chunkSize,this->_socket);
      uVar10 = String::hexToInt(&chunkSize);
      bVar7 = uVar10 == 0;
      String::~String(&chunkSize);
    }
    else {
      bVar7 = false;
    }
    while (uVar8 = uVar5, 0 < (int)uVar10) {
      uVar12 = (ulong)uVar10;
      if (15999 < uVar10) {
        uVar12 = 16000;
      }
      pSVar3 = (this->_socket->super_SmartObject)._p;
      uVar11 = (*pSVar3->_vptr_SmartObject_[0xd])(pSVar3,buffer,uVar12);
      if ((int)uVar11 < 1) {
        return;
      }
      iVar13 = iVar13 + uVar11;
      ((this->_status)._p)->p->received = iVar13;
      pHVar1 = ((this->_sink)._p)->p;
      (*pHVar1->_vptr_HttpSink[2])(pHVar1,buffer,(ulong)uVar11);
      p_Var4 = (this->_progress).f;
      if (p_Var4 != (_FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *)0x0) {
        (**(code **)(*(long *)p_Var4 + 0x18))(p_Var4,((this->_status)._p)->p);
      }
      uVar10 = uVar10 - uVar11;
      uVar5 = 0;
      if ((uVar8 != 0) && (uVar5 = uVar8 - uVar11, uVar8 - uVar11 == 0 || (int)uVar8 < (int)uVar11))
      {
        return;
      }
    }
    if ((bVar6) &&
       (pSVar3 = (this->_socket->super_SmartObject)._p,
       iVar9 = (*pSVar3->_vptr_SmartObject_[0xd])(pSVar3,buffer,2), iVar9 < 2)) {
      return;
    }
  } while( true );
}

Assistant:

void HttpMessage::readBody()
{
	int size = header("Content-Length");

	int currentsize = 0;

	bool chunked = header("Transfer-Encoding") == "chunked"; // Handle specially!!

	_sink->init(size);

	_socket->setBlocking(true);

	bool end = false;

	if (hasHeader("Content-Length")) {
		if (header("Content-Length") == "0")
			return;
	}
	else if(!chunked)
		return;

	_status->totalReceive = size;
	_status->received = 0;

	while (!end)
	{
		int av = _socket->available();
		if (av < 0 || !_socket->waitInput(10)) {
			break;
		}
		byte buffer[RECV_BLOCK_SIZE];
		int maxToRead = _socket->available(), bytesRead = 0;
		if (chunked)
		{
			String chunkSize = _socket->readLine();
			maxToRead = chunkSize.hexToInt();
			if (maxToRead == 0)
				end = true;
		}
		while (maxToRead > 0) {
			bytesRead = _socket->read(buffer, min(maxToRead, (int)sizeof(buffer)));
			if (bytesRead <= 0) {
				return;
			}
			currentsize += bytesRead;
			_status->received = currentsize;
			_sink->write(buffer, bytesRead);
			if(_progress)
				_progress(*_status);
			maxToRead -= bytesRead;
			if (size) {
				size -= bytesRead;
				if (size <= 0) {
					return;
				}
			}
		}
		//if (maxToRead == 0) // ANDROID ?
		//	break;

		if (chunked)
		{
			if (_socket->read(buffer, 2) < 2) // skip crlf
				break;
		}
	}
	//printf("readbody end\n");
}